

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

quicly_conn_t *
create_connection(quicly_context_t *ctx,uint32_t protocol_version,char *server_name,
                 sockaddr *remote_addr,sockaddr *local_addr,ptls_iovec_t *remote_cid,
                 quicly_cid_plaintext_t *local_cid,ptls_handshake_properties_t *handshake_properties
                 ,uint32_t initcwnd)

{
  int iVar1;
  ptls_t *tls_00;
  quicly_conn_t *max_ack_delay;
  kh_quicly_stream_t_t *pkVar2;
  uint64_t uVar3;
  void **ppvVar4;
  short *in_RCX;
  char *in_RDX;
  uint32_t in_ESI;
  quicly_context_t *in_RDI;
  quicly_loss_t *in_R8;
  quicly_loss_conf_t *in_R9;
  void *in_stack_00000010;
  uint32_t in_stack_00000018;
  quicly_cid_plaintext_t *in_stack_00000020;
  quicly_cid_encryptor_t *in_stack_00000028;
  quicly_local_cid_set_t *in_stack_00000030;
  quicly_conn_t *conn;
  ptls_t *tls;
  sockaddr *in_stack_ffffffffffffff18;
  quicly_address_t *in_stack_ffffffffffffff20;
  ptls_t *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  char *pcVar5;
  uint32_t cwnd;
  uint64_t in_stack_ffffffffffffff38;
  ptls_context_t *in_stack_ffffffffffffff40;
  ptls_t *in_stack_ffffffffffffff60;
  _func_void_void_ptr_size_t *in_stack_ffffffffffffffa0;
  ptls_iovec_t *in_stack_ffffffffffffffa8;
  quicly_remote_cid_set_t *in_stack_ffffffffffffffb0;
  ptls_t *tls_01;
  quicly_conn_t *local_8;
  
  cwnd = (uint32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  if ((in_RCX == (short *)0x0) || (*in_RCX == 0)) {
    __assert_fail("remote_addr != NULL && remote_addr->sa_family != AF_UNSPEC",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x7e8,
                  "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                 );
  }
  if (((in_RDI->transport_params).max_datagram_frame_size != 0) &&
     (in_RDI->receive_datagram_frame == (quicly_receive_datagram_frame_t *)0x0)) {
    __assert_fail("ctx->receive_datagram_frame != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x7ea,
                  "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                 );
  }
  tls_00 = ptls_new((ptls_context_t *)&in_stack_ffffffffffffff20->sa,
                    (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  if (tls_00 == (ptls_t *)0x0) {
    local_8 = (quicly_conn_t *)0x0;
  }
  else {
    tls_01 = tls_00;
    if (in_RDX != (char *)0x0) {
      pcVar5 = in_RDX;
      strlen(in_RDX);
      cwnd = (uint32_t)((ulong)pcVar5 >> 0x20);
      iVar1 = ptls_set_server_name
                        (tls_00,(char *)in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18)
      ;
      in_stack_ffffffffffffff28 = tls_00;
      if (iVar1 != 0) {
        ptls_free(in_stack_ffffffffffffff60);
        return (quicly_conn_t *)0x0;
      }
    }
    max_ack_delay = (quicly_conn_t *)malloc(0x9e8);
    if (max_ack_delay == (quicly_conn_t *)0x0) {
      ptls_free(in_stack_ffffffffffffff60);
      local_8 = (quicly_conn_t *)0x0;
    }
    else {
      memset(max_ack_delay,0,0x9e8);
      (max_ack_delay->super).ctx = in_RDI;
      lock_now((quicly_conn_t *)&in_stack_ffffffffffffff20->sa,
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      set_address(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      set_address(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      quicly_local_cid_init_set(in_stack_00000030,in_stack_00000028,in_stack_00000020);
      *(undefined8 *)(max_ack_delay->super).local.long_header_src_cid.cid =
           *(undefined8 *)(max_ack_delay->super).local.cid_set.cids[0].cid.cid;
      *(undefined8 *)((max_ack_delay->super).local.long_header_src_cid.cid + 8) =
           *(undefined8 *)((max_ack_delay->super).local.cid_set.cids[0].cid.cid + 8);
      *(undefined4 *)((max_ack_delay->super).local.long_header_src_cid.cid + 0x10) =
           *(undefined4 *)((max_ack_delay->super).local.cid_set.cids[0].cid.cid + 0x10);
      (max_ack_delay->super).local.long_header_src_cid.len =
           (max_ack_delay->super).local.cid_set.cids[0].cid.len;
      quicly_remote_cid_init_set
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      (max_ack_delay->super).state = QUICLY_STATE_FIRSTFLIGHT;
      if (in_RDX == (char *)0x0) {
        (max_ack_delay->super).local.bidi.next_stream_id = 1;
        (max_ack_delay->super).local.uni.next_stream_id = 3;
        (max_ack_delay->super).remote.bidi.next_stream_id = 0;
        (max_ack_delay->super).remote.uni.next_stream_id = 2;
      }
      else {
        (max_ack_delay->super).local.bidi.next_stream_id = 0;
        (max_ack_delay->super).local.uni.next_stream_id = 2;
        (max_ack_delay->super).remote.bidi.next_stream_id = 1;
        (max_ack_delay->super).remote.uni.next_stream_id = 3;
      }
      memcpy(&(max_ack_delay->super).remote.transport_params,&default_transport_params,0x68);
      (max_ack_delay->super).version = in_ESI;
      (max_ack_delay->super).remote.largest_retire_prior_to = 0;
      quicly_linklist_init(&(max_ack_delay->super)._default_scheduler.active);
      quicly_linklist_init(&(max_ack_delay->super)._default_scheduler.blocked);
      pkVar2 = kh_init_quicly_stream_t();
      max_ack_delay->streams = pkVar2;
      quicly_maxsender_init
                (&(max_ack_delay->ingress).max_data.sender,
                 (((max_ack_delay->super).ctx)->transport_params).max_data);
      quicly_maxsender_init
                (&(max_ack_delay->ingress).max_streams.uni,
                 (((max_ack_delay->super).ctx)->transport_params).max_streams_uni);
      quicly_maxsender_init
                (&(max_ack_delay->ingress).max_streams.bidi,
                 (((max_ack_delay->super).ctx)->transport_params).max_streams_bidi);
      quicly_loss_init(in_R8,in_R9,(uint32_t)((ulong)tls_01 >> 0x20),(uint16_t *)max_ack_delay,
                       (uint8_t *)in_stack_ffffffffffffffb0);
      uVar3 = calc_next_pn_to_skip
                        (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,cwnd,
                         (uint64_t)in_stack_ffffffffffffff28);
      (max_ack_delay->egress).next_pn_to_skip = uVar3;
      (max_ack_delay->egress).max_udp_payload_size =
           ((max_ack_delay->super).ctx)->initial_egress_max_udp_payload_size;
      init_max_streams((st_quicly_max_streams_t *)0x1348ac);
      init_max_streams((st_quicly_max_streams_t *)0x1348cb);
      (max_ack_delay->egress).path_challenge.tail_ref = &(max_ack_delay->egress).path_challenge.head
      ;
      (max_ack_delay->egress).ack_frequency.update_at = 0x7fffffffffffffff;
      (max_ack_delay->egress).send_ack_at = 0x7fffffffffffffff;
      (*((max_ack_delay->super).ctx)->init_cc->cb)
                (((max_ack_delay->super).ctx)->init_cc,&(max_ack_delay->egress).cc,in_stack_00000018
                 ,(max_ack_delay->stash).now);
      quicly_retire_cid_init(&(max_ack_delay->egress).retire_cid);
      quicly_linklist_init((quicly_linklist_t *)&(max_ack_delay->egress).pending_streams);
      quicly_linklist_init(&(max_ack_delay->egress).pending_streams.blocked.bidi);
      quicly_linklist_init(&(max_ack_delay->egress).pending_streams.control);
      (max_ack_delay->crypto).tls = tls_01;
      if (in_stack_00000010 == (void *)0x0) {
        in_stack_ffffffffffffff20 =
             (quicly_address_t *)&(max_ack_delay->crypto).handshake_properties;
        memset(&stack0xffffffffffffff38,0,0x80);
        memcpy(in_stack_ffffffffffffff20,&stack0xffffffffffffff38,0x80);
      }
      else {
        if (*(long *)((long)in_stack_00000010 + 0x68) != 0) {
          __assert_fail("handshake_properties->additional_extensions == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x828,
                        "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                       );
        }
        if (*(long *)((long)in_stack_00000010 + 0x70) != 0) {
          __assert_fail("handshake_properties->collect_extension == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x829,
                        "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                       );
        }
        if (*(long *)((long)in_stack_00000010 + 0x78) != 0) {
          __assert_fail("handshake_properties->collected_extensions == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x82a,
                        "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                       );
        }
        memcpy(&(max_ack_delay->crypto).handshake_properties,in_stack_00000010,0x80);
      }
      (max_ack_delay->crypto).handshake_properties.collect_extension = collect_transport_parameters;
      (max_ack_delay->retry_scid).len = 0xff;
      (max_ack_delay->idle_timeout).at = 0x7fffffffffffffff;
      (max_ack_delay->idle_timeout).field_0x8 = (max_ack_delay->idle_timeout).field_0x8 & 0xfe | 1;
      (max_ack_delay->stash).on_ack_stream.active_acked_cache.stream_id = -0x8000000000000000;
      local_8 = max_ack_delay;
      ppvVar4 = ptls_get_data_ptr(tls_01);
      *ppvVar4 = max_ack_delay;
      update_open_count((quicly_context_t *)&in_stack_ffffffffffffff20->sa,(ssize_t)max_ack_delay);
    }
  }
  return local_8;
}

Assistant:

static quicly_conn_t *create_connection(quicly_context_t *ctx, uint32_t protocol_version, const char *server_name,
                                        struct sockaddr *remote_addr, struct sockaddr *local_addr, ptls_iovec_t *remote_cid,
                                        const quicly_cid_plaintext_t *local_cid, ptls_handshake_properties_t *handshake_properties,
                                        uint32_t initcwnd)
{
    ptls_t *tls = NULL;
    quicly_conn_t *conn;

    /* consistency checks */
    assert(remote_addr != NULL && remote_addr->sa_family != AF_UNSPEC);
    if (ctx->transport_params.max_datagram_frame_size != 0)
        assert(ctx->receive_datagram_frame != NULL);

    /* create TLS context */
    if ((tls = ptls_new(ctx->tls, server_name == NULL)) == NULL)
        return NULL;
    if (server_name != NULL && ptls_set_server_name(tls, server_name, strlen(server_name)) != 0) {
        ptls_free(tls);
        return NULL;
    }

    /* allocate memory and start creating QUIC context */
    if ((conn = malloc(sizeof(*conn))) == NULL) {
        ptls_free(tls);
        return NULL;
    }
    memset(conn, 0, sizeof(*conn));
    conn->super.ctx = ctx;
    lock_now(conn, 0);
    set_address(&conn->super.local.address, local_addr);
    set_address(&conn->super.remote.address, remote_addr);
    quicly_local_cid_init_set(&conn->super.local.cid_set, ctx->cid_encryptor, local_cid);
    conn->super.local.long_header_src_cid = conn->super.local.cid_set.cids[0].cid;
    quicly_remote_cid_init_set(&conn->super.remote.cid_set, remote_cid, ctx->tls->random_bytes);
    conn->super.state = QUICLY_STATE_FIRSTFLIGHT;
    if (server_name != NULL) {
        conn->super.local.bidi.next_stream_id = 0;
        conn->super.local.uni.next_stream_id = 2;
        conn->super.remote.bidi.next_stream_id = 1;
        conn->super.remote.uni.next_stream_id = 3;
    } else {
        conn->super.local.bidi.next_stream_id = 1;
        conn->super.local.uni.next_stream_id = 3;
        conn->super.remote.bidi.next_stream_id = 0;
        conn->super.remote.uni.next_stream_id = 2;
    }
    conn->super.remote.transport_params = default_transport_params;
    conn->super.version = protocol_version;
    conn->super.remote.largest_retire_prior_to = 0;
    quicly_linklist_init(&conn->super._default_scheduler.active);
    quicly_linklist_init(&conn->super._default_scheduler.blocked);
    conn->streams = kh_init(quicly_stream_t);
    quicly_maxsender_init(&conn->ingress.max_data.sender, conn->super.ctx->transport_params.max_data);
    quicly_maxsender_init(&conn->ingress.max_streams.uni, conn->super.ctx->transport_params.max_streams_uni);
    quicly_maxsender_init(&conn->ingress.max_streams.bidi, conn->super.ctx->transport_params.max_streams_bidi);
    quicly_loss_init(&conn->egress.loss, &conn->super.ctx->loss,
                     conn->super.ctx->loss.default_initial_rtt /* FIXME remember initial_rtt in session ticket */,
                     &conn->super.remote.transport_params.max_ack_delay, &conn->super.remote.transport_params.ack_delay_exponent);
    conn->egress.next_pn_to_skip =
        calc_next_pn_to_skip(conn->super.ctx->tls, 0, initcwnd, conn->super.ctx->initial_egress_max_udp_payload_size);
    conn->egress.max_udp_payload_size = conn->super.ctx->initial_egress_max_udp_payload_size;
    init_max_streams(&conn->egress.max_streams.uni);
    init_max_streams(&conn->egress.max_streams.bidi);
    conn->egress.path_challenge.tail_ref = &conn->egress.path_challenge.head;
    conn->egress.ack_frequency.update_at = INT64_MAX;
    conn->egress.send_ack_at = INT64_MAX;
    conn->super.ctx->init_cc->cb(conn->super.ctx->init_cc, &conn->egress.cc, initcwnd, conn->stash.now);
    quicly_retire_cid_init(&conn->egress.retire_cid);
    quicly_linklist_init(&conn->egress.pending_streams.blocked.uni);
    quicly_linklist_init(&conn->egress.pending_streams.blocked.bidi);
    quicly_linklist_init(&conn->egress.pending_streams.control);
    conn->crypto.tls = tls;
    if (handshake_properties != NULL) {
        assert(handshake_properties->additional_extensions == NULL);
        assert(handshake_properties->collect_extension == NULL);
        assert(handshake_properties->collected_extensions == NULL);
        conn->crypto.handshake_properties = *handshake_properties;
    } else {
        conn->crypto.handshake_properties = (ptls_handshake_properties_t){{{{NULL}}}};
    }
    conn->crypto.handshake_properties.collect_extension = collect_transport_parameters;
    conn->retry_scid.len = UINT8_MAX;
    conn->idle_timeout.at = INT64_MAX;
    conn->idle_timeout.should_rearm_on_send = 1;
    conn->stash.on_ack_stream.active_acked_cache.stream_id = INT64_MIN;

    *ptls_get_data_ptr(tls) = conn;

    update_open_count(conn->super.ctx, 1);

    return conn;
}